

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::MinTypMaxExpression>
          (PropagationVisitor *this,MinTypMaxExpression *expr)

{
  ASTContext *context;
  MinTypMaxExpression *expr_00;
  bool bVar1;
  Type *rhs;
  Type *pTVar2;
  SourceLocation loc;
  MinTypMaxExpression *local_40;
  Expression *result;
  Type *pTStack_30;
  bool needConversion;
  Type *local_28;
  MinTypMaxExpression *local_20;
  MinTypMaxExpression *expr_local;
  PropagationVisitor *this_local;
  
  local_20 = expr;
  expr_local = (MinTypMaxExpression *)this;
  bVar1 = Expression::bad(&expr->super_Expression);
  if (bVar1) {
    return &local_20->super_Expression;
  }
  bVar1 = Type::isError(this->newType);
  if (bVar1) {
    pTStack_30 = this->newType;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_28,&stack0xffffffffffffffd0);
    (local_20->super_Expression).type.ptr = local_28;
    return &local_20->super_Expression;
  }
  pTVar2 = this->newType;
  rhs = not_null<const_slang::ast::Type_*>::operator*(&(local_20->super_Expression).type);
  bVar1 = Type::isEquivalent(pTVar2,rhs);
  result._7_1_ = (bVar1 ^ 0xffU) & 1;
  bVar1 = Type::isFloating(this->newType);
  if (bVar1) {
    pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&(local_20->super_Expression).type);
    bVar1 = Type::isFloating(pTVar2);
    if (!bVar1) goto LAB_004182e5;
  }
  else {
LAB_004182e5:
    bVar1 = Type::isIntegral(this->newType);
    if (bVar1) {
      pTVar2 = not_null<const_slang::ast::Type_*>::operator->(&(local_20->super_Expression).type);
      bVar1 = Type::isIntegral(pTVar2);
      if (bVar1) goto LAB_0041832b;
    }
    bVar1 = Type::isString(this->newType);
    if ((!bVar1) && ((local_20->super_Expression).kind != OpenRange)) goto LAB_0041834b;
  }
LAB_0041832b:
  bVar1 = MinTypMaxExpression::propagateType(local_20,this->context,this->newType);
  if (bVar1) {
    result._7_1_ = 0;
  }
LAB_0041834b:
  local_40 = local_20;
  if (result._7_1_ != 0) {
    bVar1 = SourceLocation::operator_cast_to_bool(&this->assignmentLoc);
    expr_00 = local_20;
    if (bVar1) {
      local_40 = (MinTypMaxExpression *)
                 ConversionExpression::makeImplicit
                           (this->context,this->newType,Implicit,&local_20->super_Expression,
                            this->assignmentLoc);
    }
    else {
      context = this->context;
      pTVar2 = this->newType;
      loc = SourceRange::start(&(local_20->super_Expression).sourceRange);
      local_40 = (MinTypMaxExpression *)
                 ConversionExpression::makeImplicit
                           (context,pTVar2,Propagated,&expr_00->super_Expression,loc);
    }
  }
  return &local_40->super_Expression;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }